

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O2

void __thiscall deqp::gls::AttributePack::newArray(AttributePack *this,Storage storage)

{
  pointer *pppAVar1;
  _Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
  *p_Var2;
  _Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
  *this_00;
  AttributeArray *this_01;
  ulong uVar3;
  pointer __dest;
  ulong uVar4;
  ulong uVar5;
  size_t __n;
  
  this_01 = (AttributeArray *)operator_new(0x58);
  anon_unknown_1::AttributeArray::AttributeArray(this_01,storage,this->m_ctx);
  p_Var2 = (_Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
            *)(this->m_arrays).
              super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (p_Var2 == (_Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                 *)(this->m_arrays).
                   super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    this_00 = (_Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
               *)(this->m_arrays).
                 super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    __n = (long)p_Var2 - (long)this_00;
    if (__n == 0x7ffffffffffffff8) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar5 = (long)__n >> 3;
    uVar3 = 1;
    if (p_Var2 != this_00) {
      uVar3 = uVar5;
    }
    uVar4 = uVar3 + uVar5;
    if (0xffffffffffffffe < uVar4) {
      uVar4 = 0xfffffffffffffff;
    }
    if (CARRY8(uVar3,uVar5)) {
      uVar4 = 0xfffffffffffffff;
    }
    if (uVar4 == 0) {
      __dest = (pointer)0x0;
    }
    else {
      __dest = (pointer)operator_new(uVar4 * 8);
    }
    __dest[uVar5] = this_01;
    if (0 < (long)__n) {
      memmove(__dest,this_00,__n);
    }
    std::
    _Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
    ::_M_deallocate(this_00,(pointer)((long)(this->m_arrays).
                                            super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)this_00 >> 3),(size_t)this_00);
    (this->m_arrays).
    super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
    ._M_impl.super__Vector_impl_data._M_start = __dest;
    (this->m_arrays).
    super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)((long)__dest + __n + 8);
    (this->m_arrays).
    super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = __dest + uVar4;
  }
  else {
    (p_Var2->_M_impl).super__Vector_impl_data._M_start = (pointer)this_01;
    pppAVar1 = &(this->m_arrays).
                super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppAVar1 = *pppAVar1 + 1;
  }
  return;
}

Assistant:

void AttributePack::newArray (DrawTestSpec::Storage storage)
{
	m_arrays.push_back(new AttributeArray(storage, m_ctx));
}